

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgobs.cpp
# Opt level: O1

int compute_text_top_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Object prev;
  Am_Object local_10;
  
  local_10.data = (Am_Object_Data *)0x0;
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)PREV);
  Am_Object::operator=(&local_10,pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_10,0x65);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_10,0x67);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::~Am_Object(&local_10);
  return iVar1 + iVar2 + 10;
}

Assistant:

void
init_arc_window()
{

  arc_window = Am_Window.Create("arc_window")
                   .Set(Am_LEFT, 800)
                   .Set(Am_TOP, 10)
                   .Set(Am_WIDTH, 320)
                   .Set(Am_HEIGHT, 300)
                   .Set(Am_TITLE, "Testing Opal Arcs")

                   .Add_Part(Am_Arc.Create("arc1")
                                 .Set(Am_LEFT, 130)
                                 .Set(Am_TOP, 160)
                                 .Set(Am_WIDTH, 20)
                                 .Set(Am_HEIGHT, 20)
                                 .Set(Am_FILL_STYLE, Am_No_Style))

                   .Add_Part(Am_Arc.Create("arc2")
                                 .Set(Am_LEFT, 20)
                                 .Set(Am_TOP, 20)
                                 .Set(Am_WIDTH, 150)
                                 .Set(Am_HEIGHT, 70)
                                 .Set(Am_ANGLE1, 0)
                                 .Set(Am_ANGLE2, 180)
                                 .Set(Am_FILL_STYLE, Am_No_Style))

                   .Add_Part(Am_Arc.Create("arc3")
                                 .Set(Am_LEFT, 50)
                                 .Set(Am_TOP, 140)
                                 .Set(Am_WIDTH, 70)
                                 .Set(Am_HEIGHT, 140)
                                 .Set(Am_LINE_STYLE, dash15)
                                 .Set(Am_FILL_STYLE, Am_Red))

                   .Add_Part(Am_Arc.Create("arc4")
                                 .Set(Am_LEFT, 60)
                                 .Set(Am_TOP, 40)
                                 .Set(Am_WIDTH, 90)
                                 .Set(Am_HEIGHT, 90)
                                 .Set(Am_ANGLE1, 300)
                                 .Set(Am_ANGLE2, 270)
                                 .Set(Am_LINE_STYLE, dash15)
                                 .Set(Am_FILL_STYLE, Am_Blue))

                   .Add_Part(Am_Arc.Create("arc5")
                                 .Set(Am_LEFT, 0)
                                 .Set(Am_TOP, -30)
                                 .Set(Am_WIDTH, 50)
                                 .Set(Am_HEIGHT, 300)
                                 .Set(Am_ANGLE1, 240)
                                 .Set(Am_ANGLE2, 60)
                                 .Set(Am_LINE_STYLE, Am_Line_4)
                                 .Set(Am_FILL_STYLE, Am_Green))

                   .Add_Part(Am_Arc.Create("arc6")
                                 .Set(Am_LEFT, 10)
                                 .Set(Am_TOP, 240)
                                 .Set(Am_WIDTH, 280)
                                 .Set(Am_HEIGHT, 50)
                                 .Set(Am_ANGLE1, -36)
                                 .Set(Am_ANGLE2, 72)
                                 .Set(Am_LINE_STYLE, Am_No_Style)
                                 .Set(Am_FILL_STYLE, Am_Blue))

                   .Add_Part(Am_Arc.Create("arc7")
                                 .Set(Am_LEFT, -10)
                                 .Set(Am_TOP, 70)
                                 .Set(Am_WIDTH, 300)
                                 .Set(Am_HEIGHT, 200)
                                 .Set(Am_ANGLE1, 23)
                                 .Set(Am_ANGLE2, 45)
                                 .Set(Am_LINE_STYLE, dash8)
                                 .Set(Am_FILL_STYLE, Am_Red))

                   .Add_Part(Am_Arc.Create("arc8")
                                 .Set(Am_LEFT, 200)
                                 .Set(Am_TOP, 160)
                                 .Set(Am_WIDTH, 80)
                                 .Set(Am_HEIGHT, 80)
                                 .Set(Am_LINE_STYLE, dash20)
                                 .Set(Am_FILL_STYLE, Am_Yellow))

                   .Add_Part(Am_Arc.Create("arc9")
                                 .Set(Am_LEFT, 50)
                                 .Set(Am_TOP, 140)
                                 .Set(Am_WIDTH, 70)
                                 .Set(Am_HEIGHT, 140)
                                 .Set(Am_FILL_STYLE, Am_No_Style))

                   .Add_Part(Am_Arc.Create("arc10")
                                 .Set(Am_LEFT, 60)
                                 .Set(Am_TOP, 40)
                                 .Set(Am_WIDTH, 90)
                                 .Set(Am_HEIGHT, 90)
                                 .Set(Am_ANGLE1, 300)
                                 .Set(Am_ANGLE2, 270)
                                 .Set(Am_FILL_STYLE, Am_No_Style))

                   .Add_Part(Am_Arc.Create("arc11")
                                 .Set(Am_LEFT, 200)
                                 .Set(Am_TOP, 160)
                                 .Set(Am_WIDTH, 80)
                                 .Set(Am_HEIGHT, 80)
                                 .Set(Am_FILL_STYLE, Am_No_Style));
}